

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O2

void anon_unknown.dwarf_4c53f::Gc::expect_call
               (test_watch_thread *gc,string *path,process_identifier pid)

{
  TypedExpectation<int_(std::initializer_list<const_char_*>)> *pTVar1;
  TypedExpectation<void_(const_int_&)> *pTVar2;
  undefined4 in_register_00000014;
  StringLike<std::__cxx11::basic_string<char>_> *str;
  void **in_R8;
  ReturnAction<int> RStack_148;
  Expectation exp;
  undefined1 local_128 [40];
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  MatcherBase<std::initializer_list<const_char_*>_> local_d8;
  Action<int_(std::initializer_list<const_char_*>)> local_c0;
  undefined1 local_a0 [8];
  size_type local_98;
  MockSpec<int_(std::initializer_list<const_char_*>)> local_90;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
  local_70;
  
  local_98 = (anonymous_namespace)::Gc::vacuum_exe_abi_cxx11_;
  testing::StrEq<char_const*>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_128,(testing *)&local_98,
             (StringLike<const_char_*> *)CONCAT44(in_register_00000014,pid));
  testing::StrEq<std::__cxx11::string>(&local_100,(testing *)path,str);
  local_a0 = (undefined1  [8])0x0;
  testing::
  ElementsAre<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>,decltype(nullptr)>
            ((ElementsAreMatcher<std::tuple<testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>_>
              *)&local_70,(testing *)local_128,&local_100,
             (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0,in_R8);
  testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
            ((Matcher<std::initializer_list<const_char_*>_> *)&local_d8,
             (ElementsAreMatcher *)&local_70);
  test_watch_thread::gmock_spawn
            (&local_90,gc,(Matcher<std::initializer_list<const_char_*>_> *)&local_d8);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<int_(std::initializer_list<const_char_*>)>::
           InternalExpectedAt(&local_90,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                              ,0x7b,"gc",
                              "spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr))"
                             );
  testing::internal::ReturnAction<int>::ReturnAction(&RStack_148,pid);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_c0,(ReturnAction *)&RStack_148);
  pTVar1 = testing::internal::TypedExpectation<int_(std::initializer_list<const_char_*>)>::WillOnce
                     (pTVar1,&local_c0);
  testing::Expectation::Expectation(&exp,&pTVar1->super_ExpectationBase);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&RStack_148.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase
            ((MatcherBase<std::initializer_list<const_char_*>_> *)&local_90.matchers_);
  testing::internal::MatcherBase<std::initializer_list<const_char_*>_>::~MatcherBase(&local_d8);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::nullptr_t>
  ::~_Tuple_impl(&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_128);
  local_100.impl_.string_._M_string_length =
       (size_type)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::EqMatcher<int>,true>>()
       ::kVTable;
  local_100.impl_.string_._M_dataplus._M_p = (pointer)&PTR__MatcherBase_0018a3f8;
  local_100.impl_.string_.field_2._M_allocated_capacity._0_4_ = pid;
  test_watch_thread::gmock_kill
            ((MockSpec<void_(const_int_&)> *)local_128,gc,(Matcher<const_int_&> *)&local_100);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<void_(const_int_&)>::InternalExpectedAt
                     ((MockSpec<void_(const_int_&)> *)local_128,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_gc.cpp"
                      ,0x7d,"gc","kill (Eq (pid))");
  pTVar2 = testing::internal::TypedExpectation<void_(const_int_&)>::Times(pTVar2,1);
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_70,&exp);
  testing::internal::TypedExpectation<void_(const_int_&)>::After(pTVar2,(ExpectationSet *)&local_70)
  ;
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_70);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)(local_128 + 8));
  testing::internal::MatcherBase<const_int_&>::~MatcherBase((MatcherBase<const_int_&> *)&local_100);
  testing::Expectation::~Expectation(&exp);
  return;
}

Assistant:

void Gc::expect_call (test_watch_thread & gc, std::string const & path,
                          process_identifier pid) {
        Expectation const exp =
            EXPECT_CALL (gc,
                         spawn (ElementsAre (StrEq (vacuum_exe.c_str ()), StrEq (path), nullptr)))
                .WillOnce (Return (pid));
        EXPECT_CALL (gc, kill (Eq (pid))).Times (1).After (exp);
    }